

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O0

printable_vtable * __thiscall
printable_vtable::operator=(printable_vtable *this,large_printable *value)

{
  large_printable local_2058;
  undefined1 local_40 [8];
  printable_vtable temp;
  large_printable *value_local;
  printable_vtable *this_local;
  
  temp.value_ = value;
  large_printable::large_printable(&local_2058,value);
  printable_vtable<large_printable>((printable_vtable *)local_40,&local_2058);
  large_printable::~large_printable(&local_2058);
  std::swap<printable_vtable>((printable_vtable *)local_40,this);
  ~printable_vtable((printable_vtable *)local_40);
  return this;
}

Assistant:

printable_vtable & operator= (T value)
    {
        printable_vtable temp(std::move(value));
        std::swap(temp, *this);
        return *this;
    }